

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::formatter<std::chrono::duration<int,std::ratio<15l,4l>>,char,void>::spec_handler&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v5::formatter<std::chrono::duration<int,_std::ratio<15L,_4L>_>,_char,_void>::spec_handler_&,_char>
                 *handler)

{
  byte bVar1;
  char cVar2;
  spec_handler *psVar3;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *this;
  formatter<std::chrono::duration<int,_std::ratio<15L,_4L>_>,_char,_void> *pfVar4;
  byte *pbVar5;
  byte *pbVar6;
  char *pcVar7;
  uint uVar8;
  byte *pbVar9;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    formatter<std::chrono::duration<int,_std::ratio<15L,_4L>_>,_char,_void>::spec_handler::
    on_dynamic_width<fmt::v5::internal::auto_id>(handler->handler);
  }
  else {
    if ((byte)(bVar1 - 0x30) < 10) {
      begin = begin + 1;
      uVar8 = 0;
      pcVar7 = begin;
      if (bVar1 != 0x30) {
        while (uVar8 < 0xccccccd) {
          uVar8 = ((int)pcVar7[-1] + uVar8 * 10) - 0x30;
          begin = end;
          if ((pcVar7 == end) ||
             (cVar2 = *pcVar7, begin = pcVar7, pcVar7 = pcVar7 + 1, 9 < (byte)(cVar2 - 0x30U)))
          goto LAB_0012594f;
        }
        uVar8 = 0x80000000;
        begin = pcVar7 + -1;
LAB_0012594f:
        if ((int)uVar8 < 0) {
          formatter<std::chrono::duration<int,_std::ratio<15L,_4L>_>,_char,_void>::spec_handler::
          on_error(handler->handler,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == ':' || (*begin == '}')))) {
        psVar3 = handler->handler;
        this = psVar3->context;
        if (this->next_arg_id_ < 1) {
          this->next_arg_id_ = -1;
          pfVar4 = psVar3->f;
          (pfVar4->width_ref).kind = INDEX;
          (pfVar4->width_ref).field_1.index = uVar8;
          return begin;
        }
        error_handler::on_error
                  ((error_handler *)this,"cannot switch from automatic to manual argument indexing")
        ;
      }
    }
    else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar6 = (byte *)(begin + 1);
      do {
        pbVar5 = pbVar6;
        pbVar9 = (byte *)end;
        if (pbVar5 == (byte *)end) break;
        bVar1 = *pbVar5;
        pbVar6 = pbVar5 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar9 = pbVar5, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      pfVar4 = handler->handler->f;
      (pfVar4->width_ref).kind = NAME;
      (pfVar4->width_ref).field_1.name.value = begin;
      (pfVar4->width_ref).field_1.name.size = (long)pbVar9 - (long)begin;
      return (char *)pbVar9;
    }
    formatter<std::chrono::duration<int,_std::ratio<15L,_4L>_>,_char,_void>::spec_handler::on_error
              (handler->handler,"invalid format string");
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}